

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

ostream * pstd::operator<<(ostream *os,optional<pbrt::Point2<int>_> *opt)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  optional<pbrt::Point2<int>_> *in_RSI;
  ostream *in_RDI;
  Point2<int> *in_stack_00000008;
  ostream *in_stack_00000010;
  optional<pbrt::Point2<int>_> *in_stack_ffffffffffffffd0;
  ostream *local_8;
  
  bVar1 = optional<pbrt::Point2<int>_>::has_value(in_RSI);
  if (bVar1) {
    poVar2 = std::operator<<(in_RDI,"[ pstd::optional<");
    pcVar3 = std::type_info::name((type_info *)&pbrt::Point2<int>::typeinfo);
    poVar2 = std::operator<<(poVar2,pcVar3);
    poVar2 = std::operator<<(poVar2,"> set: true ");
    std::operator<<(poVar2,"value: ");
    optional<pbrt::Point2<int>_>::value(in_stack_ffffffffffffffd0);
    poVar2 = pbrt::operator<<(in_stack_00000010,in_stack_00000008);
    local_8 = std::operator<<(poVar2," ]");
  }
  else {
    poVar2 = std::operator<<(in_RDI,"[ pstd::optional<");
    pcVar3 = std::type_info::name((type_info *)&pbrt::Point2<int>::typeinfo);
    poVar2 = std::operator<<(poVar2,pcVar3);
    local_8 = std::operator<<(poVar2,"> set: false value: n/a ]");
  }
  return local_8;
}

Assistant:

inline std::ostream &operator<<(std::ostream &os, const optional<T> &opt) {
    if (opt.has_value())
        return os << "[ pstd::optional<" << typeid(T).name() << "> set: true "
                  << "value: " << opt.value() << " ]";
    else
        return os << "[ pstd::optional<" << typeid(T).name()
                  << "> set: false value: n/a ]";
}